

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O3

wchar_t __thiscall Centaurus::Stream::skip_whitespace(Stream *this)

{
  wchar_t *pwVar1;
  int iVar2;
  wchar_t wVar3;
  
LAB_0014849c:
  do {
    pwVar1 = (this->m_cur)._M_current;
    if (pwVar1 == (this->m_str)._M_dataplus._M_p + (this->m_str)._M_string_length) {
      iVar2 = iswspace(0);
      if (iVar2 == 0) {
        return L'\0';
      }
    }
    else {
      wVar3 = *pwVar1;
      iVar2 = iswspace(wVar3);
      if (iVar2 == 0) {
        if (wVar3 != L'/') {
          return wVar3;
        }
        pwVar1 = (this->m_cur)._M_current;
        if (pwVar1 == (this->m_str)._M_dataplus._M_p + (this->m_str)._M_string_length) {
          return L'/';
        }
        wVar3 = pwVar1[1];
        if (wVar3 == L'*') {
          iVar2 = 2;
          do {
            get(this);
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
          skip_multiline_comment(this);
        }
        else {
          if (wVar3 != L'/') {
            return L'/';
          }
          iVar2 = 2;
          do {
            get(this);
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
          do {
            wVar3 = get(this);
            if (wVar3 == L'\0') break;
          } while (wVar3 != L'\n');
        }
        goto LAB_0014849c;
      }
    }
    get(this);
  } while( true );
}

Assistant:

wchar_t skip_whitespace()
    {
        wchar_t ch;

        while (true)
        {
            ch = peek();

            if (std::iswspace(ch))
            {
                discard();
            }
            else if (ch == L'/')
            {
                ch = peek(2);
                if (ch == L'*')
                {
                    discard(2);
                    skip_multiline_comment();
                }
                else if (ch == L'/')
                {
                    discard(2);
                    skip_oneline_comment();
                }
                else
                {
                    return L'/';
                }
            }
            else
            {
                break;
            }
        }
        return ch;
    }